

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

int bgzf_close(BGZF *fp)

{
  void *__src;
  hFILE *fp_00;
  uint *__ptr;
  int iVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ulong totalbytes;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  iVar3 = -1;
  if (fp == (BGZF *)0x0) {
    return -1;
  }
  if (((undefined1  [96])*fp & (undefined1  [96])0x60000000) != (undefined1  [96])0x0 &&
      ((undefined1  [96])*fp & (undefined1  [96])0x30000) != (undefined1  [96])0x0) {
    iVar1 = bgzf_flush(fp);
    if (iVar1 != 0) {
      return -1;
    }
    *(uint *)fp = *(uint *)fp | 0x1ff00000;
    iVar1 = deflate_block(fp,0);
    __src = fp->compressed_block;
    fp_00 = fp->fp;
    totalbytes = (ulong)iVar1;
    uVar6 = (long)fp_00->limit - (long)fp_00->begin;
    uVar5 = totalbytes;
    if (uVar6 < totalbytes) {
      uVar5 = uVar6;
    }
    memcpy(fp_00->begin,__src,uVar5);
    fp_00->begin = fp_00->begin + uVar5;
    if (uVar6 < totalbytes) {
      uVar5 = hwrite2(fp_00,__src,totalbytes,uVar5);
    }
    if (((long)uVar5 < 0) || (iVar1 = hflush(fp->fp), iVar1 != 0)) {
      *(byte *)fp = *(byte *)fp | 4;
      return -1;
    }
    if (fp->mt != (mtaux_t *)0x0) {
      mt_destroy(fp->mt);
    }
  }
  if ((int)*(uint *)fp < 0) {
    if ((*(uint *)fp & 0x30000) == 0) {
      inflateEnd(fp->gz_stream);
    }
    else {
      deflateEnd();
    }
    free(fp->gz_stream);
  }
  iVar1 = hclose(fp->fp);
  if (iVar1 == 0) {
    bgzf_index_destroy(fp);
    free(fp->uncompressed_block);
    free(fp->compressed_block);
    if ((fp->field_0x2 & 3) == 0) {
      __ptr = (uint *)fp->cache;
      uVar2 = *__ptr;
      if (uVar2 != 0) {
        lVar7 = 4;
        bVar4 = 0;
        uVar5 = 0;
        do {
          if ((*(uint *)(*(long *)(__ptr + 4) + (uVar5 >> 4) * 4) >> (bVar4 & 0x1e) & 3) == 0) {
            free(*(void **)(*(long *)(__ptr + 8) + lVar7 * 2));
            uVar2 = *__ptr;
          }
          uVar5 = uVar5 + 1;
          lVar7 = lVar7 + 0xc;
          bVar4 = bVar4 + 2;
        } while (uVar5 < uVar2);
      }
      free(*(void **)(__ptr + 6));
      free(*(void **)(__ptr + 4));
      free(*(void **)(__ptr + 8));
      free(__ptr);
    }
    free(fp);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int bgzf_close(BGZF* fp)
{
    int ret, block_length;
    if (fp == 0) return -1;
    if (fp->is_write && fp->is_compressed) {
        if (bgzf_flush(fp) != 0) return -1;
        fp->compress_level = -1;
        block_length = deflate_block(fp, 0); // write an empty block
        if (hwrite(fp->fp, fp->compressed_block, block_length) < 0
            || hflush(fp->fp) != 0) {
            fp->errcode |= BGZF_ERR_IO;
            return -1;
        }
#ifdef BGZF_MT
        if (fp->mt) mt_destroy(fp->mt);
#endif
    }
    if ( fp->is_gzip )
    {
        if (!fp->is_write) (void)inflateEnd(fp->gz_stream);
        else (void)deflateEnd(fp->gz_stream);
        free(fp->gz_stream);
    }
    ret = hclose(fp->fp);
    if (ret != 0) return -1;
    bgzf_index_destroy(fp);
    free(fp->uncompressed_block);
    free(fp->compressed_block);
    free_cache(fp);
    free(fp);
    return 0;
}